

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

void Cgt_ManCollectVisited(Aig_Man_t *pAig,Vec_Ptr_t *vFanout,Vec_Ptr_t *vVisited)

{
  long lVar1;
  
  vVisited->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  if (0 < vFanout->nSize) {
    lVar1 = 0;
    do {
      Cgt_ManCollectVisited_rec(pAig,(Aig_Obj_t *)vFanout->pArray[lVar1],vVisited);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vFanout->nSize);
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited( Aig_Man_t * pAig, Vec_Ptr_t * vFanout, Vec_Ptr_t * vVisited )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vVisited );
    Aig_ManIncrementTravId( pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
        Cgt_ManCollectVisited_rec( pAig, pObj, vVisited );
}